

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local.cpp
# Opt level: O3

HLOCAL LocalFree(HLOCAL hMem)

{
  BOOL BVar1;
  HANDLE hHeap;
  HLOCAL pVVar2;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (hMem == (HLOCAL)0x0) {
      pVVar2 = (HLOCAL)0x0;
    }
    else {
      hHeap = GetProcessHeap();
      BVar1 = HeapFree(hHeap,0,hMem);
      pVVar2 = (HLOCAL)0x0;
      if (BVar1 != 1) {
        pVVar2 = hMem;
      }
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
      return pVVar2;
    }
  }
  abort();
}

Assistant:

HLOCAL
PALAPI
LocalFree(
	  IN HLOCAL hMem)
{
    BOOL bRetVal = FALSE;
    PERF_ENTRY(LocalFree);
    ENTRY("LocalFree (hmem=%p)\n", hMem);

    if ( hMem )
    {
        bRetVal = HeapFree( GetProcessHeap(), 0, hMem );
    }
    else
    {
        bRetVal = TRUE;
    }
    
    LOGEXIT( "LocalFree returning %p.\n", bRetVal == TRUE ? (HLOCAL)NULL : hMem );
    PERF_EXIT(LocalFree);
    return bRetVal == TRUE ? (HLOCAL)NULL : hMem;
}